

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

UnicodeString * icu_63::ICUServiceKey::parsePrefix(UnicodeString *result)

{
  uint uVar1;
  char *__filename;
  
  uVar1 = UnicodeString::indexOf(result,L'/');
  __filename = (char *)0x0;
  if (0 < (int)uVar1) {
    __filename = (char *)(ulong)uVar1;
  }
  UnicodeString::remove(result,__filename);
  return result;
}

Assistant:

UnicodeString& 
ICUServiceKey::parsePrefix(UnicodeString& result) 
{
    int32_t n = result.indexOf(PREFIX_DELIMITER);
    if (n < 0) {
        n = 0;
    }
    result.remove(n);
    return result;
}